

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemMsgLoader.cpp
# Opt level: O0

void __thiscall xercesc_4_0::InMemMsgLoader::InMemMsgLoader(InMemMsgLoader *this,XMLCh *msgDomain)

{
  bool bVar1;
  XMLCh *pXVar2;
  XMLCh *msgDomain_local;
  InMemMsgLoader *this_local;
  
  XMLMsgLoader::XMLMsgLoader(&this->super_XMLMsgLoader);
  (this->super_XMLMsgLoader)._vptr_XMLMsgLoader = (_func_int **)&PTR__InMemMsgLoader_00537600;
  this->fMsgDomain = (XMLCh *)0x0;
  bVar1 = XMLString::equals(msgDomain,(XMLCh *)XMLUni::fgXMLErrDomain);
  if (!bVar1) {
    bVar1 = XMLString::equals(msgDomain,(XMLCh *)XMLUni::fgExceptDomain);
    if (!bVar1) {
      bVar1 = XMLString::equals(msgDomain,(XMLCh *)XMLUni::fgXMLDOMMsgDomain);
      if (!bVar1) {
        bVar1 = XMLString::equals(msgDomain,(XMLCh *)XMLUni::fgValidityDomain);
        if (!bVar1) {
          XMLPlatformUtils::panic(Panic_UnknownMsgDomain);
        }
      }
    }
  }
  pXVar2 = XMLString::replicate(msgDomain,XMLPlatformUtils::fgMemoryManager);
  this->fMsgDomain = pXVar2;
  return;
}

Assistant:

InMemMsgLoader::InMemMsgLoader(const XMLCh* const msgDomain)
:fMsgDomain(0)
{
    if (!XMLString::equals(msgDomain, XMLUni::fgXMLErrDomain)
    &&  !XMLString::equals(msgDomain, XMLUni::fgExceptDomain)
    &&  !XMLString::equals(msgDomain, XMLUni::fgXMLDOMMsgDomain)
    &&  !XMLString::equals(msgDomain, XMLUni::fgValidityDomain))
    {
        XMLPlatformUtils::panic(PanicHandler::Panic_UnknownMsgDomain);
    }

    fMsgDomain = XMLString::replicate(msgDomain, XMLPlatformUtils::fgMemoryManager);
}